

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O1

int str_all_space(char *str)

{
  ushort **ppuVar1;
  char cVar2;
  char *pcVar3;
  
  cVar2 = *str;
  if (cVar2 != '\0') {
    ppuVar1 = __ctype_b_loc();
    pcVar3 = str + 1;
    do {
      if ((*(byte *)((long)*ppuVar1 + (long)cVar2 * 2 + 1) & 0x20) == 0) {
        return 0;
      }
      cVar2 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar2 != '\0');
  }
  return 1;
}

Assistant:

int str_all_space(const char *str) {
  const char *p = str;
  while (*p) {
    if (isspace(*p) == 0) {
      return 0;
    }
    ++p;
  }
  return 1;
}